

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O0

stmm_table * Abc_NtkFraigEquiv(Abc_Ntk_t *pNtk,int fUseInv,int fVerbose,int fVeryVerbose)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  stmm_table *table;
  Abc_Obj_t *pAVar4;
  stmm_table *table_00;
  stmm_generator *gen_00;
  char *pcVar5;
  undefined8 uVar6;
  uint local_68;
  uint local_64;
  int Counter;
  int c;
  stmm_generator *gen;
  stmm_table *tResult;
  stmm_table *tStrash2Net;
  Abc_Obj_t **ppSlot;
  Fraig_Node_t *gNode;
  Abc_Obj_t *pNodeAig;
  Abc_Obj_t *pNode;
  Abc_Obj_t *pList;
  int local_18;
  int fVeryVerbose_local;
  int fVerbose_local;
  int fUseInv_local;
  Abc_Ntk_t *pNtk_local;
  
  pList._4_4_ = fVeryVerbose;
  local_18 = fVerbose;
  fVeryVerbose_local = fUseInv;
  _fVerbose_local = pNtk;
  table = stmm_init_table(stmm_ptrcmp,stmm_ptrhash);
  for (local_64 = 0; iVar2 = Vec_PtrSize(_fVerbose_local->vObjs), (int)local_64 < iVar2;
      local_64 = local_64 + 1) {
    pNodeAig = Abc_NtkObj(_fVerbose_local,local_64);
    if ((((pNodeAig != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pNodeAig), iVar2 != 0)) &&
        (iVar2 = Abc_ObjFaninNum(pNodeAig), iVar2 != 0)) &&
       ((gNode = (Fraig_Node_t *)(pNodeAig->field_6).pCopy, gNode != (Fraig_Node_t *)0x0 &&
        (pAVar4 = Abc_NodeFindCoFanout(pNodeAig), pAVar4 == (Abc_Obj_t *)0x0)))) {
      pAVar4 = Abc_ObjRegular((Abc_Obj_t *)gNode);
      pvVar1 = (pAVar4->field_6).pTemp;
      iVar2 = Abc_ObjIsComplement((Abc_Obj_t *)gNode);
      ppSlot = (Abc_Obj_t **)((ulong)pvVar1 ^ (long)iVar2);
      iVar2 = stmm_find_or_add(table,(char *)((ulong)ppSlot & 0xfffffffffffffffe),
                               (char ***)&tStrash2Net);
      if (iVar2 == 0) {
        tStrash2Net->compare = (stmm_compare_func_type)0x0;
      }
      pNodeAig->pNext = (Abc_Obj_t *)tStrash2Net->compare;
      tStrash2Net->compare = (stmm_compare_func_type)pNodeAig;
      *(uint *)&pNodeAig->field_0x14 =
           *(uint *)&pNodeAig->field_0x14 & 0xffffff7f | ((uint)ppSlot & 1) << 7;
    }
  }
  local_64 = 0;
  local_68 = 0;
  table_00 = stmm_init_table(stmm_ptrcmp,stmm_ptrhash);
  gen_00 = stmm_init_gen(table);
  while (iVar2 = stmm_gen(gen_00,(char **)&ppSlot,(char **)&pNode), iVar2 != 0) {
    if ((pNode != (Abc_Obj_t *)0x0) && (pNode->pNext != (Abc_Obj_t *)0x0)) {
      stmm_insert(table_00,(char *)pNode,(char *)0x0);
      for (pNodeAig = pNode; pNodeAig != (Abc_Obj_t *)0x0; pNodeAig = pNodeAig->pNext) {
        local_68 = local_68 + 1;
      }
      if (pList._4_4_ != 0) {
        printf("Class %2d : {",(ulong)local_64);
        for (pNodeAig = pNode; pNodeAig != (Abc_Obj_t *)0x0; pNodeAig = pNodeAig->pNext) {
          (pNodeAig->field_6).pTemp = (void *)0x0;
          pcVar5 = Abc_ObjName(pNodeAig);
          printf(" %s",pcVar5);
          uVar6 = 0x2b;
          if ((*(uint *)&pNodeAig->field_0x14 >> 7 & 1) != 0) {
            uVar6 = 0x2d;
          }
          printf("(%c)",uVar6);
          printf("(%d)",(ulong)(*(uint *)&pNodeAig->field_0x14 >> 0xc));
        }
        printf(" }\n");
        local_64 = local_64 + 1;
      }
    }
  }
  stmm_free_gen(gen_00);
  if ((local_18 != 0) || (pList._4_4_ != 0)) {
    printf("Sweeping stats for network \"%s\":\n",_fVerbose_local->pName);
    uVar3 = Abc_NtkNodeNum(_fVerbose_local);
    printf("Internal nodes = %d. Different functions (up to compl) = %d.\n",(ulong)uVar3,
           (ulong)(uint)table->num_entries);
    printf("Non-trivial classes = %d. Nodes in non-trivial classes = %d.\n",
           (ulong)(uint)table_00->num_entries,(ulong)local_68);
  }
  stmm_free_table(table);
  return table_00;
}

Assistant:

stmm_table * Abc_NtkFraigEquiv( Abc_Ntk_t * pNtk, int fUseInv, int fVerbose, int fVeryVerbose )
{
    Abc_Obj_t * pList, * pNode, * pNodeAig;
    Fraig_Node_t * gNode;
    Abc_Obj_t ** ppSlot;
    stmm_table * tStrash2Net;
    stmm_table * tResult;
    stmm_generator * gen;
    int c, Counter;

    // create mapping of strashed nodes into the corresponding network nodes
    tStrash2Net = stmm_init_table(stmm_ptrcmp,stmm_ptrhash);
    Abc_NtkForEachNode( pNtk, pNode, c )
    {
        // skip the constant input nodes
        if ( Abc_ObjFaninNum(pNode) == 0 )
            continue;
        // get the strashed node
        pNodeAig = pNode->pCopy;
        // skip the dangling nodes
        if ( pNodeAig == NULL )
            continue;
        // skip the nodes that fanout into COs
        if ( Abc_NodeFindCoFanout(pNode) )
            continue;
        // get the FRAIG node
        gNode = Fraig_NotCond( Abc_ObjRegular(pNodeAig)->pCopy, (int)Abc_ObjIsComplement(pNodeAig) );
        if ( !stmm_find_or_add( tStrash2Net, (char *)Fraig_Regular(gNode), (char ***)&ppSlot ) )
            *ppSlot = NULL;
        // add the node to the list
        pNode->pNext = *ppSlot;
        *ppSlot = pNode;
        // mark the node if it is complemented
        pNode->fPhase = Fraig_IsComplement(gNode);
    }

    // print the classes
    c = 0;
    Counter = 0;
    tResult = stmm_init_table(stmm_ptrcmp,stmm_ptrhash);
    stmm_foreach_item( tStrash2Net, gen, (char **)&gNode, (char **)&pList )
    {
        // skip the trival classes
        if ( pList == NULL || pList->pNext == NULL )
            continue;
        // add the non-trival class
        stmm_insert( tResult, (char *)pList, NULL );
        // count nodes in the non-trival classes
        for ( pNode = pList; pNode; pNode = pNode->pNext )
            Counter++;

        if ( fVeryVerbose )
        {
            printf( "Class %2d : {", c );
            for ( pNode = pList; pNode; pNode = pNode->pNext )
            {
                pNode->pCopy = NULL;
                printf( " %s", Abc_ObjName(pNode) );
                printf( "(%c)", pNode->fPhase? '-' : '+' );
                printf( "(%d)", pNode->Level );
            }
            printf( " }\n" );
            c++;
        }
    }
    if ( fVerbose || fVeryVerbose )
    {
        printf( "Sweeping stats for network \"%s\":\n", pNtk->pName );
        printf( "Internal nodes = %d. Different functions (up to compl) = %d.\n", Abc_NtkNodeNum(pNtk), stmm_count(tStrash2Net) );
        printf( "Non-trivial classes = %d. Nodes in non-trivial classes = %d.\n", stmm_count(tResult), Counter );
    }
    stmm_free_table( tStrash2Net );
    return tResult;
}